

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_key.cpp
# Opt level: O2

string * __thiscall
cfd::api::KeyApi::GetPubkeyFromPrivkey
          (string *__return_storage_ptr__,KeyApi *this,string *privkey,bool is_compressed)

{
  bool bVar1;
  NetType net_type;
  Privkey local_58;
  Privkey key;
  
  core::Privkey::Privkey(&key);
  net_type = kMainnet;
  bVar1 = core::Privkey::HasWif(privkey,&net_type,(bool *)0x0);
  if (bVar1) {
    core::Privkey::FromWif(&local_58,privkey,net_type,is_compressed);
  }
  else {
    core::Privkey::Privkey(&local_58,privkey,kMainnet,true);
  }
  core::Privkey::operator=(&key,&local_58);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58);
  core::Privkey::GeneratePubkey((Pubkey *)&local_58,&key,is_compressed);
  core::Pubkey::GetHex_abi_cxx11_(__return_storage_ptr__,(Pubkey *)&local_58);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key);
  return __return_storage_ptr__;
}

Assistant:

std::string KeyApi::GetPubkeyFromPrivkey(
    const std::string& privkey, bool is_compressed) const {
  Privkey key;
  NetType net_type = NetType::kMainnet;

  bool has_wif = Privkey::HasWif(privkey, &net_type, nullptr);
  if (has_wif) {
    key = Privkey::FromWif(privkey, net_type, is_compressed);
  } else {
    key = Privkey(privkey);
  }
  return key.GeneratePubkey(is_compressed).GetHex();
}